

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::MeshLoader::loadSourceElement(MeshLoader *this,InputShared *input)

{
  Semantic SVar1;
  MeshLoader *pMVar2;
  Semantic *pSVar3;
  SourceBase *sourceBase;
  String *pSVar4;
  ostream *poVar5;
  MeshLoader *this_00;
  MeshLoader *pMVar6;
  URI *copyFrom_;
  bool bVar7;
  Semantic SStack_13c;
  String SStack_138;
  URI UStack_118;
  
  SVar1 = (input->super_InputUnshared).mSemantic;
  switch(SVar1) {
  case NORMAL:
    bVar7 = loadNormalsSourceElement(this,input);
    return bVar7;
  case OUTPUT:
  case OUT_TANGENT:
  case TANGENT:
    return false;
  case POSITION:
    bVar7 = loadPositionsSourceElement(this,input);
    return bVar7;
  case TEXBINORMAL:
    bVar7 = loadTexBinormalSourceElement(this,input);
    return bVar7;
  case TEXCOORD:
  case UV:
    bVar7 = loadTexCoordsSourceElement(this,input);
    return bVar7;
  case TEXTANGENT:
    bVar7 = loadTexTangentSourceElement(this,input);
    return bVar7;
  }
  if (SVar1 != COLOR) {
    return false;
  }
  SStack_13c = (input->super_InputUnshared).mSemantic;
  if (SStack_13c != COLOR) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a COLOR element!",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI(&UStack_118,copyFrom_,false);
  SStack_138._M_dataplus._M_p = (pointer)&SStack_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&SStack_138,UStack_118.mFragment._M_dataplus._M_p,
             UStack_118.mFragment._M_dataplus._M_p + UStack_118.mFragment._M_string_length);
  this_00 = this;
  sourceBase = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&SStack_138);
  if (sourceBase != (SourceBase *)0x0) {
    pMVar2 = (MeshLoader *)(sourceBase->mLoadedInputElements).mCount;
    bVar7 = pMVar2 != (MeshLoader *)0x0;
    if (bVar7) {
      pSVar3 = (sourceBase->mLoadedInputElements).mData;
      if (*pSVar3 == SStack_13c) goto LAB_00827616;
      this_00 = (MeshLoader *)0x1;
      do {
        pMVar6 = this_00;
        this_00 = pMVar6;
        if (pMVar2 == pMVar6) break;
        this_00 = (MeshLoader *)
                  ((long)&(pMVar6->super_SourceArrayLoader).super_FilePartLoader.
                          super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader + 1);
      } while (pSVar3[(long)pMVar6] != SStack_13c);
      bVar7 = pMVar6 < pMVar2;
    }
    if (!bVar7) {
      if (sourceBase->mStride - 5 < 0xfffffffffffffffe) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"The color source ",0x11);
        pSVar4 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pSVar4->_M_dataplus)._M_p,
                            pSVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," has a wrong dimension of ",0x1a)
        ;
        poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,". Dimensions between 3 (RGB) and 4 (RGBA) are allowed. ",0x37);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        bVar7 = false;
      }
      else {
        bVar7 = appendVertexValues(this_00,sourceBase,&this->mMesh->mColors);
      }
      SourceBase::addLoadedInputElement(sourceBase,&SStack_13c);
      goto LAB_00827733;
    }
  }
LAB_00827616:
  bVar7 = false;
LAB_00827733:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_138._M_dataplus._M_p != &SStack_138.field_2) {
    operator_delete(SStack_138._M_dataplus._M_p,SStack_138.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&UStack_118);
  return bVar7;
}

Assistant:

bool MeshLoader::loadSourceElement ( const InputShared& input )
    {
        bool retValue = false;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        switch ( semantic )
        {
        case InputSemantic::POSITION:
            retValue = loadPositionsSourceElement ( input );
            break;
        case InputSemantic::NORMAL:
            retValue = loadNormalsSourceElement ( input );
            break;
        case InputSemantic::COLOR:
            retValue = loadColorsSourceElement ( input );
            break;
        case InputSemantic::UV:
        case InputSemantic::TEXCOORD:
            retValue = loadTexCoordsSourceElement ( input );
            break;
        case InputSemantic::TEXTANGENT:
            retValue = loadTexTangentSourceElement( input );
            break;
        case InputSemantic::TEXBINORMAL:
            retValue = loadTexBinormalSourceElement( input );
            break;
        default:
            // Not implemented source
//            std::cerr << "Source with semantic " << semantic << "not implemented!" << std::endl;
            retValue = false;
        }

        return retValue;
    }